

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OctoquadIdentifier.cpp
# Opt level: O1

bool __thiscall
UnifiedRegex::OctoquadMatcher::Match
          (OctoquadMatcher *this,Char *input,CharCount inputLength,CharCount *offset,
          RegexStats *stats)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  int i;
  long lVar6;
  
  if (7 < inputLength) {
    uVar4 = *offset;
    uVar3 = 0;
    if (uVar4 <= inputLength - 8) {
      lVar6 = 0;
      do {
        if (stats != (RegexStats *)0x0) {
          stats->numCompares = stats->numCompares + 1;
        }
        uVar3 = uVar3 << 4;
        if ((ulong)(ushort)input[uVar4 + (int)lVar6] < 0x80) {
          uVar3 = uVar3 | this->charToBits[(ushort)input[uVar4 + (int)lVar6]];
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 != 8);
      uVar1 = this->patterns[0];
      if (((uVar3 & uVar1) + 0xeeeeeeef & 0x88888888) != 0) {
        uVar2 = this->patterns[1];
        uVar5 = (ulong)(uVar4 + 8);
        do {
          if (((uVar3 & uVar2) + 0xeeeeeeef & 0x88888888) == 0) break;
          if (inputLength <= uVar5) {
            return false;
          }
          if (stats != (RegexStats *)0x0) {
            stats->numCompares = stats->numCompares + 1;
          }
          uVar3 = uVar3 << 4;
          if ((ulong)(ushort)input[uVar5] < 0x80) {
            uVar3 = uVar3 | this->charToBits[(ushort)input[uVar5]];
          }
          uVar5 = uVar5 + 1;
        } while (((uVar3 & uVar1) + 0xeeeeeeef & 0x88888888) != 0);
        uVar4 = (int)uVar5 - 8;
      }
      *offset = uVar4;
      return true;
    }
  }
  return false;
}

Assistant:

bool OctoquadMatcher::Match
        ( const Char* const input
        , const CharCount inputLength
        , CharCount& offset
#if ENABLE_REGEX_CONFIG_OPTIONS
        , RegexStats* stats
#endif
        )
    {
        Assert(TrigramInfo::PatternLength == 8);
        Assert(OctoquadIdentifier::NumPatterns == 2);

        if (inputLength < TrigramInfo::PatternLength)
            return false;
        if (offset > inputLength - TrigramInfo::PatternLength)
            return false;

        uint32 v = 0;
        for (int i = 0; i < TrigramInfo::PatternLength; i++)
        {
#if ENABLE_REGEX_CONFIG_OPTIONS
            if (stats != 0)
                stats->numCompares++;
#endif
            v <<= 4;
            if (CTU(input[offset + i]) < TrigramAlphabet::AsciiTableSize)
                v |= charToBits[CTU(input[offset + i])];
        }

        const uint32 lp = patterns[0];
        const uint32 rp = patterns[1];
        CharCount next = offset + TrigramInfo::PatternLength;

        while (true)
        {
            if (oneBitSetInEveryQuad(v & lp) || oneBitSetInEveryQuad(v & rp))
            {
                offset = next - TrigramInfo::PatternLength;
                return true;
            }
            if (next >= inputLength)
                return false;
#if ENABLE_REGEX_CONFIG_OPTIONS
            if (stats != 0)
                stats->numCompares++;
#endif
            v <<= 4;
            if (CTU(input[next]) < TrigramAlphabet::AsciiTableSize)
                v |= charToBits[CTU(input[next])];
            next++;
        }
    }